

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O0

void duckdb::ArrowBool8::DuckToArrow
               (ClientContext *context,Vector *source,Vector *result,idx_t count)

{
  UnifiedVectorFormat *this;
  ulong in_RCX;
  idx_t i;
  int8_t *result_ptr;
  bool *source_ptr;
  Vector *in_stack_00000030;
  UnifiedVectorFormat format;
  ValidityMask *in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  ulong uVar1;
  long local_60;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat(in_stack_00000030,(idx_t)source_ptr,(UnifiedVectorFormat *)result_ptr);
  FlatVector::SetValidity(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this = (UnifiedVectorFormat *)FlatVector::GetData((Vector *)0x152e47d);
  for (uVar1 = 0; uVar1 < in_RCX; uVar1 = uVar1 + 1) {
    *(byte *)((long)&this->sel + uVar1) = *(byte *)(local_60 + uVar1) & 1;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void DuckToArrow(ClientContext &context, Vector &source, Vector &result, idx_t count) {
		UnifiedVectorFormat format;
		source.ToUnifiedFormat(count, format);
		FlatVector::SetValidity(result, format.validity);
		auto source_ptr = reinterpret_cast<bool *>(format.data);
		auto result_ptr = reinterpret_cast<int8_t *>(FlatVector::GetData(result));
		for (idx_t i = 0; i < count; i++) {
			result_ptr[i] = static_cast<int8_t>(source_ptr[i]);
		}
	}